

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void ShowAllRooms(void)

{
  Room *pRVar1;
  uint uVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  if (0 < Admin::Innopolis->rooms_len) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      pRVar1 = Admin::Innopolis->rooms;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(int *)((long)&pRVar1->room_id + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = *(char **)((long)&pRVar1->name + lVar5);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar2 = *(int *)((long)&pRVar1->standardAccess + lVar5) - 1;
      pcVar6 = "non-level";
      if (uVar2 < 4) {
        pcVar6 = &DAT_001062f8 + *(int *)(&DAT_001062f8 + (ulong)uVar2 * 4);
      }
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar7 < Admin::Innopolis->rooms_len);
  }
  return;
}

Assistant:

void ShowAllRooms(){
    Room* user;
    for(int i=0;i<Admin::Innopolis->rooms_len;i++){
        user =&(Admin::Innopolis->rooms[i]);
        cout<<user->room_id<<" "<<user->getName()<<" "<<user->getAccessLevel()<<endl;
    }
}